

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_async_generator_free(JSRuntime *rt,JSAsyncGeneratorData *s)

{
  list_head *plVar1;
  int iVar2;
  list_head *plVar3;
  JSValue JVar4;
  list_head *plVar5;
  
  plVar5 = (s->queue).next;
  if (plVar5 != &s->queue) {
    do {
      plVar3 = plVar5->next;
      plVar1 = plVar5[1].next;
      JVar4 = *(JSValue *)&plVar5[1].next;
      if ((0xfffffff4 < (uint)plVar5[2].prev) &&
         (iVar2 = *(int *)&plVar1->prev, *(int *)&plVar1->prev = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(rt,JVar4);
      }
      plVar1 = plVar5[2].next;
      JVar4 = *(JSValue *)&plVar5[2].next;
      if ((0xfffffff4 < (uint)plVar5[3].prev) &&
         (iVar2 = *(int *)&plVar1->prev, *(int *)&plVar1->prev = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(rt,JVar4);
      }
      plVar1 = plVar5[3].next;
      JVar4 = *(JSValue *)&plVar5[3].next;
      if ((0xfffffff4 < (uint)plVar5[4].prev) &&
         (iVar2 = *(int *)&plVar1->prev, *(int *)&plVar1->prev = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(rt,JVar4);
      }
      plVar1 = plVar5[4].next;
      JVar4 = *(JSValue *)&plVar5[4].next;
      if ((0xfffffff4 < (uint)plVar5[5].prev) &&
         (iVar2 = *(int *)&plVar1->prev, *(int *)&plVar1->prev = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(rt,JVar4);
      }
      (*(rt->mf).js_free)(&rt->malloc_state,plVar5);
      plVar5 = plVar3;
    } while (plVar3 != &s->queue);
  }
  if ((s->state & ~JS_ASYNC_GENERATOR_STATE_SUSPENDED_YIELD) !=
      JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
    async_func_free(rt,&s->func_state);
  }
  (*(rt->mf).js_free)(&rt->malloc_state,s);
  return;
}

Assistant:

static void js_async_generator_free(JSRuntime *rt,
                                    JSAsyncGeneratorData *s)
{
    struct list_head *el, *el1;
    JSAsyncGeneratorRequest *req;

    list_for_each_safe(el, el1, &s->queue) {
        req = list_entry(el, JSAsyncGeneratorRequest, link);
        JS_FreeValueRT(rt, req->result);
        JS_FreeValueRT(rt, req->promise);
        JS_FreeValueRT(rt, req->resolving_funcs[0]);
        JS_FreeValueRT(rt, req->resolving_funcs[1]);
        js_free_rt(rt, req);
    }
    if (s->state != JS_ASYNC_GENERATOR_STATE_COMPLETED &&
        s->state != JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
        async_func_free(rt, &s->func_state);
    }
    js_free_rt(rt, s);
}